

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O0

Vector3d * __thiscall OpenMD::Molecule::getPrevCom(Molecule *this)

{
  StuntDouble *in_RSI;
  Vector<double,_3U> *in_RDI;
  RealType mass;
  RealType totalMass;
  iterator i;
  StuntDouble *sd;
  Vector3d *com;
  Vector<double,_3U> *this_00;
  iterator *in_stack_ffffffffffffffa8;
  Molecule *in_stack_ffffffffffffffb0;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_20;
  StuntDouble *local_18;
  
  this_00 = in_RDI;
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_20);
  Vector3<double>::Vector3((Vector3<double> *)0x304848);
  local_18 = beginIntegrableObject(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  while (local_18 != (StuntDouble *)0x0) {
    StuntDouble::getMass(local_18);
    StuntDouble::getPrevPos(in_RSI);
    OpenMD::operator*((Vector<double,_3U> *)in_RSI,(double)this_00);
    Vector<double,_3U>::operator+=(this_00,in_RDI);
    local_18 = nextIntegrableObject(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  Vector<double,_3U>::operator/=(this_00,(double)in_RDI);
  return (Vector3d *)in_RDI;
}

Assistant:

Vector3d Molecule::getPrevCom() {
    StuntDouble* sd;
    std::vector<StuntDouble*>::iterator i;
    Vector3d com {};
    RealType totalMass {};
    RealType mass {};

    for (sd = beginIntegrableObject(i); sd != NULL;
         sd = nextIntegrableObject(i)) {
      mass = sd->getMass();
      totalMass += mass;
      com += sd->getPrevPos() * mass;
    }

    com /= totalMass;

    return com;
  }